

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMapIterator.cpp
# Opt level: O0

Var Js::JavascriptMapIterator::EntryNext(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  WriteBarrierPtr<void> WVar2;
  bool bVar3;
  int n;
  CallFlags e;
  ScriptContext *pSVar4;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar5;
  JavascriptLibrary *this_00;
  Var aValue;
  JavascriptMapIterator *pJVar6;
  JavascriptMap **ppJVar7;
  KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_> *other;
  JavascriptArray *pJVar8;
  void **ppvVar9;
  undefined1 local_c0 [8];
  undefined1 local_b8 [8];
  undefined1 local_b0 [8];
  KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_> local_a8;
  JavascriptArray *keyValueTuple;
  Var result;
  KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_> entry;
  Type *mapIterator;
  JavascriptMap *map;
  JavascriptMapIterator *iterator;
  Var thisObj;
  JavascriptLibrary *library;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar4 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar4);
  pSVar4 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar4,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar3 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptMapIterator.cpp"
                                ,0x16,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  pSVar4 = RecyclableObject::GetScriptContext(function);
  this_00 = ScriptContext::GetLibrary(pSVar4);
  e = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar3 = operator!(e);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptMapIterator.cpp"
                                ,0x1a,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  aValue = Arguments::operator[]((Arguments *)&scriptContext,0);
  bVar3 = VarIs<Js::JavascriptMapIterator>(aValue);
  if (bVar3) {
    pJVar6 = VarTo<Js::JavascriptMapIterator>(aValue);
    ppJVar7 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptMap__
                        ((WriteBarrierPtr *)&pJVar6->m_map);
    if ((*ppJVar7 == (JavascriptMap *)0x0) ||
       (bVar3 = MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
                ::Iterator::Next(&pJVar6->m_mapIterator), !bVar3)) {
      entry.value.ptr = (void *)0x0;
      Memory::WriteBarrierPtr<Js::JavascriptMap>::operator=(&pJVar6->m_map,&entry.value.ptr);
      callInfo_local = (CallInfo)JavascriptLibrary::CreateIteratorResultObjectDone(this_00);
    }
    else {
      other = MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
              ::Iterator::Current(&pJVar6->m_mapIterator);
      JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>::
      KeyValuePair((KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_> *)
                   &result,other);
      if (pJVar6->m_kind == KeyAndValue) {
        pJVar8 = JavascriptLibrary::CreateArray(this_00,2);
        local_a8.value.ptr = pJVar8;
        JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>::Key
                  ((KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_> *)
                   (local_b0 + 8));
        ppvVar9 = Memory::WriteBarrierPtr::operator_cast_to_void__
                            ((WriteBarrierPtr *)(local_b0 + 8));
        (*(pJVar8->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
          super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                  (pJVar8,0,*ppvVar9);
        WVar2.ptr = local_a8.value.ptr;
        JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>::Value
                  ((KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_> *)
                   local_b0);
        ppvVar9 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)local_b0);
        (**(code **)(*(long *)&(((ArrayObject *)WVar2.ptr)->super_DynamicObject).
                               super_RecyclableObject.super_FinalizableObject + 0x148))
                  (WVar2.ptr,1,*ppvVar9,0);
        keyValueTuple = (JavascriptArray *)local_a8.value.ptr;
      }
      else if (pJVar6->m_kind == Key) {
        JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>::Key
                  ((KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_> *)
                   local_b8);
        ppvVar9 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)local_b8);
        keyValueTuple = (JavascriptArray *)*ppvVar9;
      }
      else {
        if (pJVar6->m_kind != Value) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptMapIterator.cpp"
                                      ,0x3d,"(iterator->m_kind == JavascriptMapIteratorKind::Value)"
                                      ,"iterator->m_kind == JavascriptMapIteratorKind::Value");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>::Value
                  ((KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_> *)
                   local_c0);
        ppvVar9 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)local_c0);
        keyValueTuple = (JavascriptArray *)*ppvVar9;
      }
      callInfo_local =
           (CallInfo)JavascriptLibrary::CreateIteratorResultObject(this_00,keyValueTuple,false);
    }
    return (Var)callInfo_local;
  }
  JavascriptError::ThrowTypeError(pSVar4,-0x7ff5ebf3,L"Map Iterator.prototype.next");
}

Assistant:

Var JavascriptMapIterator::EntryNext(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        JavascriptLibrary* library = scriptContext->GetLibrary();

        Assert(!(callInfo.Flags & CallFlags_New));

        Var thisObj = args[0];

        if (!VarIs<JavascriptMapIterator>(thisObj))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedMapIterator, _u("Map Iterator.prototype.next"));
        }

        JavascriptMapIterator* iterator = VarTo<JavascriptMapIterator>(thisObj);
        JavascriptMap* map = iterator->m_map;
        auto& mapIterator = iterator->m_mapIterator;

        if (map == nullptr || !mapIterator.Next())
        {
            iterator->m_map = nullptr;
            return library->CreateIteratorResultObjectDone();
        }

        auto entry = mapIterator.Current();
        Var result;

        if (iterator->m_kind == JavascriptMapIteratorKind::KeyAndValue)
        {
            JavascriptArray* keyValueTuple = library->CreateArray(2);
            keyValueTuple->SetItem(0, entry.Key(), PropertyOperation_None);
            keyValueTuple->SetItem(1, entry.Value(), PropertyOperation_None);
            result = keyValueTuple;
        }
        else if (iterator->m_kind == JavascriptMapIteratorKind::Key)
        {
            result = entry.Key();
        }
        else
        {
            Assert(iterator->m_kind == JavascriptMapIteratorKind::Value);
            result = entry.Value();
        }

        return library->CreateIteratorResultObject(result);
    }